

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

size_t InternalHashToName::SortAndCullByHash(InternalHashToName *a,size_t a_count)

{
  int iVar1;
  InternalHashToName *pIVar2;
  InternalHashToName *pIVar3;
  ulong local_38;
  size_t i;
  InternalHashToName *k1;
  size_t culled_count;
  size_t a_count_local;
  InternalHashToName *a_local;
  
  if ((a == (InternalHashToName *)0x0) || (a_count == 0)) {
    a_local = (InternalHashToName *)0x0;
  }
  else {
    ON_qsort(a,a_count,0x20,CompareHash);
    k1 = (InternalHashToName *)0x1;
    i = (size_t)a;
    for (local_38 = 1; local_38 < a_count; local_38 = local_38 + 1) {
      iVar1 = CompareHash((void *)i,a + local_38);
      if (iVar1 != 0) {
        pIVar3 = a + local_38;
        pIVar2 = a + (long)k1;
        *(undefined8 *)(pIVar2->m_dirty_name_hash).m_digest =
             *(undefined8 *)(pIVar3->m_dirty_name_hash).m_digest;
        *(undefined8 *)((pIVar2->m_dirty_name_hash).m_digest + 8) =
             *(undefined8 *)((pIVar3->m_dirty_name_hash).m_digest + 8);
        *(undefined8 *)((pIVar2->m_dirty_name_hash).m_digest + 0x10) =
             *(undefined8 *)((pIVar3->m_dirty_name_hash).m_digest + 0x10);
        pIVar2->m_family_name = pIVar3->m_family_name;
        i = (size_t)(a + (long)k1);
        k1 = (InternalHashToName *)((k1->m_dirty_name_hash).m_digest + 1);
      }
    }
    a_local = k1;
  }
  return (size_t)a_local;
}

Assistant:

static size_t SortAndCullByHash(InternalHashToName* a, size_t a_count)
  {
    if (nullptr == a || a_count <= 0)
      return 0;

    ON_qsort(a, a_count, sizeof(a[0]), InternalHashToName::CompareHash);
    size_t culled_count = 1;
    const InternalHashToName* k1 = &a[0];
    for (size_t i = 1; i < a_count; i++)
    {
      if (0 == InternalHashToName::CompareHash(k1, &a[i]) )
        continue;
      a[culled_count] = a[i];
      k1 = &a[culled_count];
      culled_count++;
    }
    return culled_count;
  }